

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

size_t __thiscall
Memory::HeapInfo::Check<Memory::LargeHeapBlock>
          (HeapInfo *this,bool expectFull,bool expectPending,LargeHeapBlock *list,
          LargeHeapBlock *tail)

{
  undefined7 in_register_00000011;
  anon_class_16_3_167268d5 fn;
  undefined6 uStack_2e;
  undefined1 local_28 [8];
  size_t heapBlockCount;
  LargeHeapBlock *tail_local;
  LargeHeapBlock *list_local;
  bool expectPending_local;
  bool expectFull_local;
  
  tail_local = (LargeHeapBlock *)CONCAT71(in_register_00000011,expectPending);
  list_local._7_1_ = (byte)this & 1;
  local_28 = (undefined1  [8])0x0;
  fn._8_8_ = tail;
  fn.heapBlockCount =
       (size_t *)(CONCAT62(uStack_2e,CONCAT11(expectFull,(byte)this)) & 0xffffffffffffff01);
  heapBlockCount = (size_t)list;
  list_local._6_1_ = expectFull;
  HeapBlockList::
  ForEach<Memory::LargeHeapBlock,Memory::HeapInfo::Check<Memory::LargeHeapBlock>(bool,bool,Memory::LargeHeapBlock*,Memory::LargeHeapBlock*)::_lambda(Memory::LargeHeapBlock*)_1_>
            ((HeapBlockList *)tail_local,list,(LargeHeapBlock *)local_28,fn);
  return (size_t)(_func_int **)local_28;
}

Assistant:

size_t
HeapInfo::Check(bool expectFull, bool expectPending, TBlockType * list, TBlockType * tail)
{
    size_t heapBlockCount = 0;
    HeapBlockList::ForEach(list, tail, [&heapBlockCount, expectFull, expectPending](TBlockType * heapBlock)
    {
        heapBlock->Check(expectFull, expectPending);
        heapBlockCount++;
    });
    return heapBlockCount;
}